

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLibrary.cpp
# Opt level: O0

bool __thiscall
Jinx::Impl::Library::RegisterPropertyNameInternal
          (Library *this,PropertyName *propertyName,bool checkForDuplicates)

{
  String *pSVar1;
  size_t sVar2;
  bool local_d9;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Impl::PropertyName>
  local_b8;
  _Self local_38;
  _Self local_30;
  undefined1 local_21;
  PropertyName *pPStack_20;
  bool checkForDuplicates_local;
  PropertyName *propertyName_local;
  Library *this_local;
  
  local_d9 = false;
  local_21 = checkForDuplicates;
  pPStack_20 = propertyName;
  propertyName_local = (PropertyName *)this;
  if (checkForDuplicates) {
    pSVar1 = PropertyName::GetName_abi_cxx11_(propertyName);
    local_30._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Impl::PropertyName,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::StaticAllocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Impl::PropertyName>,_4096UL,_16UL>_>
         ::find(&this->m_propertyNameTable,pSVar1);
    local_38._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Impl::PropertyName,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::StaticAllocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Impl::PropertyName>,_4096UL,_16UL>_>
         ::end(&this->m_propertyNameTable);
    local_d9 = std::operator!=(&local_30,&local_38);
  }
  if (local_d9 == false) {
    pSVar1 = PropertyName::GetName_abi_cxx11_(pPStack_20);
    std::
    make_pair<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>const&,Jinx::Impl::PropertyName_const&>
              (&local_b8,pSVar1,pPStack_20);
    std::
    map<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>,Jinx::Impl::PropertyName,std::less<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>>,Jinx::StaticAllocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>const,Jinx::Impl::PropertyName>,4096ul,16ul>>
    ::
    insert<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>,Jinx::Impl::PropertyName>>
              ((map<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>,Jinx::Impl::PropertyName,std::less<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>>,Jinx::StaticAllocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>const,Jinx::Impl::PropertyName>,4096ul,16ul>>
                *)&this->m_propertyNameTable,&local_b8);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Impl::PropertyName>
    ::~pair(&local_b8);
    sVar2 = PropertyName::GetPartCount(pPStack_20);
    if (this->m_maxPropertyParts < sVar2) {
      sVar2 = PropertyName::GetPartCount(pPStack_20);
      this->m_maxPropertyParts = sVar2;
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline_t bool Library::RegisterPropertyNameInternal(const PropertyName & propertyName, bool checkForDuplicates)
	{
		if (checkForDuplicates && (m_propertyNameTable.find(propertyName.GetName()) != m_propertyNameTable.end()))
			return false;
		m_propertyNameTable.insert(std::make_pair(propertyName.GetName(), propertyName));
		if (propertyName.GetPartCount() > m_maxPropertyParts)
			m_maxPropertyParts = propertyName.GetPartCount();
		return true;
	}